

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogFinish(void)

{
  ImGuiLogType IVar1;
  _func_void_void_ptr_char_ptr *p_Var2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  
  pIVar3 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    IVar1 = pIVar3->LogType;
    if (IVar1 == ImGuiLogType_Clipboard) {
      if (1 < (pIVar3->LogBuffer).Buf.Size) {
        p_Var2 = (GImGui->IO).SetClipboardTextFn;
        if (p_Var2 != (_func_void_void_ptr_char_ptr *)0x0) {
          pcVar4 = (pIVar3->LogBuffer).Buf.Data;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = ImGuiTextBuffer::EmptyString;
          }
          (*p_Var2)((GImGui->IO).ClipboardUserData,pcVar4);
        }
      }
    }
    else if (IVar1 == ImGuiLogType_File) {
      fclose((FILE *)pIVar3->LogFile);
    }
    else if (IVar1 == ImGuiLogType_TTY) {
      fflush((FILE *)pIVar3->LogFile);
    }
    pIVar3->LogEnabled = false;
    pIVar3->LogType = ImGuiLogType_None;
    pIVar3->LogFile = (ImFileHandle)0x0;
    ImGuiTextBuffer::clear(&pIVar3->LogBuffer);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}